

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::DescriptorProto::~DescriptorProto(DescriptorProto *this)

{
  ulong uVar1;
  undefined8 *puVar2;
  
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if (puVar2 == (undefined8 *)0x0) {
    SharedDtor(this);
    internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
              (&(this->super_Message).super_MessageLite._internal_metadata_);
  }
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~RepeatedPtrField(&this->reserved_name_);
  RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::~RepeatedPtrField
            (&this->reserved_range_);
  RepeatedPtrField<google::protobuf::OneofDescriptorProto>::~RepeatedPtrField(&this->oneof_decl_);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::~RepeatedPtrField(&this->extension_);
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::~RepeatedPtrField
            (&this->extension_range_);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::~RepeatedPtrField(&this->enum_type_);
  RepeatedPtrField<google::protobuf::DescriptorProto>::~RepeatedPtrField(&this->nested_type_);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::~RepeatedPtrField(&this->field_);
  MessageLite::~MessageLite((MessageLite *)this);
  return;
}

Assistant:

DescriptorProto::~DescriptorProto() {
  // @@protoc_insertion_point(destructor:google.protobuf.DescriptorProto)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>();
}